

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  int i;
  int y;
  int x;
  ImGuiWindowSettings *settings;
  ImVec2ih local_3c;
  ImVec2ih local_38;
  int local_34;
  short local_30 [2];
  short local_2c [2];
  long local_28;
  undefined8 local_20;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  iVar1 = __isoc99_sscanf(in_RCX,"Pos=%i,%i",local_2c,local_30);
  if (iVar1 == 2) {
    ImVec2ih::ImVec2ih(&local_38,local_2c[0],local_30[0]);
    *(ImVec2ih *)(local_28 + 4) = local_38;
  }
  else {
    iVar1 = __isoc99_sscanf(local_20,"Size=%i,%i",local_2c,local_30);
    if (iVar1 == 2) {
      ImVec2ih::ImVec2ih(&local_3c,local_2c[0],local_30[0]);
      *(ImVec2ih *)(local_28 + 8) = local_3c;
    }
    else {
      iVar1 = __isoc99_sscanf(local_20,"Collapsed=%d",&local_34);
      if (iVar1 == 1) {
        *(bool *)(local_28 + 0xc) = local_34 != 0;
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)         { settings->Pos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)   { settings->Size = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     { settings->Collapsed = (i != 0); }
}